

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O2

void __thiscall
rsg::Shader::getOutputs
          (Shader *this,
          vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *outputs)

{
  pointer ppVVar1;
  pointer ppVVar2;
  Variable *var;
  Variable *local_28;
  
  ppVVar1 = (outputs->
            super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((outputs->super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppVVar1) {
    (outputs->super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = ppVVar1;
  }
  for (ppVVar2 = (this->m_globalScope).m_declaredVariables.
                 super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppVVar2 !=
      (this->m_globalScope).m_declaredVariables.
      super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppVVar2 = ppVVar2 + 1) {
    local_28 = *ppVVar2;
    if (local_28->m_storage == STORAGE_SHADER_OUT) {
      std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::push_back
                (outputs,&local_28);
    }
  }
  return;
}

Assistant:

void Shader::getOutputs (vector<const Variable*>& outputs) const
{
	outputs.clear();
	const vector<Variable*>& globalVars = m_globalScope.getDeclaredVariables();
	for (vector<Variable*>::const_iterator i = globalVars.begin(); i != globalVars.end(); i++)
	{
		const Variable* var = *i;
		if (var->getStorage() == Variable::STORAGE_SHADER_OUT)
			outputs.push_back(var);
	}
}